

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O2

void __thiscall TcpSocketTest::Run(TcpSocketTest *this)

{
  Selector *this_00;
  
  this_00 = (Selector *)
            operator_new(0x278,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                         ,0x281);
  Selector::Selector(this_00,"TcpSelector");
  this->mSelector = this_00;
  test1(this);
  test2(this);
  test3(this);
  if (this->mSelector != (Selector *)0x0) {
    (**(code **)(*(long *)this->mSelector + 0x58))();
  }
  TestCase::TestPassed(&this->super_TestCase);
  return;
}

Assistant:

void TcpSocketTest::Run()
{

  mSelector = jh_new Selector( "TcpSelector" );
  test1();
  test2();
  test3();

  delete mSelector;
  TestPassed();

}